

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O2

NumberParseMatcher ** __thiscall
icu_63::MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3>::resize
          (MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_3> *this,
          int32_t newCapacity,int32_t length)

{
  NumberParseMatcher **__dest;
  
  if ((0 < newCapacity) &&
     (__dest = (NumberParseMatcher **)uprv_malloc_63((ulong)(uint)newCapacity << 3),
     __dest != (NumberParseMatcher **)0x0)) {
    if (0 < length) {
      if (this->capacity < length) {
        length = this->capacity;
      }
      if (newCapacity <= length) {
        length = newCapacity;
      }
      memcpy(__dest,this->ptr,(long)length << 3);
    }
    releaseArray(this);
    this->ptr = __dest;
    this->capacity = newCapacity;
    this->needToRelease = '\x01';
    return __dest;
  }
  return (NumberParseMatcher **)0x0;
}

Assistant:

inline T *MaybeStackArray<T, stackCapacity>::resize(int32_t newCapacity, int32_t length) {
    if(newCapacity>0) {
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
      ::fprintf(::stderr,"MaybeStacArray (resize) alloc %d * %lu\n", newCapacity,sizeof(T));
#endif
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            if(length>0) {
                if(length>capacity) {
                    length=capacity;
                }
                if(length>newCapacity) {
                    length=newCapacity;
                }
                uprv_memcpy(p, ptr, (size_t)length*sizeof(T));
            }
            releaseArray();
            ptr=p;
            capacity=newCapacity;
            needToRelease=TRUE;
        }
        return p;
    } else {
        return NULL;
    }
}